

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

iterator * cs_impl::array_cs_ext::erase(iterator *__return_storage_ptr__,array *arr,iterator *pos)

{
  iterator local_28;
  
  local_28._M_cur = pos->_M_cur;
  local_28._M_node = pos->_M_node;
  local_28._M_first = *local_28._M_node;
  local_28._M_last = local_28._M_first + 0x40;
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_erase
            (__return_storage_ptr__,arr,&local_28);
  return __return_storage_ptr__;
}

Assistant:

array::iterator erase(array &arr, array::iterator &pos)
		{
			return arr.erase(pos);
		}